

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEngine.c
# Opt level: O0

JsEngine * JsCreateEngine(void)

{
  JsVm *pJVar1;
  JsEngine *e_00;
  JsList pvVar2;
  JsLock pvVar3;
  JsEngine *e;
  JsVm *vm;
  
  pJVar1 = JsGetVm();
  e_00 = (JsEngine *)JsMalloc(0x30);
  e_00->vm = pJVar1;
  JsEngine2Vm(e_00);
  e_00->state = JS_ENGINE_KERNEL;
  e_00->exec = (JsContext *)0x0;
  pvVar2 = JsCreateList();
  e_00->waits = pvVar2;
  pvVar2 = JsCreateList();
  e_00->pools = pvVar2;
  pvVar3 = JsCreateLock();
  e_00->lock = pvVar3;
  return e_00;
}

Assistant:

struct JsEngine* JsCreateEngine(){
	struct JsVm* vm = JsGetVm();
	struct JsEngine* e = (struct JsEngine*)JsMalloc(sizeof(struct JsEngine));
	e->vm = vm;
	JsEngine2Vm(e);
	
	e->state = JS_ENGINE_KERNEL;
	
	e->exec = NULL;
	e->waits = JsCreateList();
	e->pools = JsCreateList();
	
	e->lock = JsCreateLock();
	return e;
}